

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O1

void Sto_ManMemoryStop(Sto_Man_t *p)

{
  char *__ptr;
  char *pcVar1;
  
  __ptr = p->pChunkLast;
  if (__ptr != (char *)0x0) {
    for (pcVar1 = *(char **)__ptr; pcVar1 != (char *)0x0; pcVar1 = *(char **)pcVar1) {
      free(__ptr);
      __ptr = pcVar1;
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Sto_ManMemoryStop( Sto_Man_t * p )
{
    char * pMem, * pNext;
    if ( p->pChunkLast == NULL )
        return;
    for ( pMem = p->pChunkLast; (pNext = *(char **)pMem); pMem = pNext )
        ABC_FREE( pMem );
    ABC_FREE( pMem );
}